

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall
QMenuPrivate::popup(QMenuPrivate *this,QPoint *p,QAction *atAction,PositionFunction positionFunction
                   )

{
  quint8 *pqVar1;
  QPointer<QScreen> *this_00;
  QMenuCaused *this_01;
  ushort uVar2;
  QWidget *this_02;
  QMenuScroller *pQVar3;
  Data *pDVar4;
  QRect *pQVar5;
  qreal qVar6;
  Representation RVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  char cVar11;
  ushort uVar12;
  Representation RVar13;
  Representation RVar14;
  QObject *pQVar15;
  QTLWExtra *pQVar16;
  QWindow *pQVar17;
  QWidget *pQVar18;
  QMenuBar *pQVar19;
  QGraphicsProxyWidget *pQVar20;
  QScreen *screen;
  QPushButton *pQVar21;
  QStyle *pQVar22;
  ulong uVar23;
  QMenu *pQVar24;
  QPoint QVar25;
  function<QPoint_(const_QSize_&)> *in_RCX;
  uint uVar26;
  int iVar27;
  Representation RVar28;
  ulong uVar29;
  QRect *this_03;
  int iVar30;
  uint orient;
  long lVar31;
  Representation RVar32;
  int iVar33;
  QRect *pQVar34;
  long lVar35;
  int *piVar36;
  QWidget *this_04;
  long in_FS_OFFSET;
  QRect QVar37;
  QSize local_c0;
  Representation local_b8;
  int local_a8;
  QPoint mouse;
  QSize menuSizeHint;
  QPoint local_70;
  QRect local_68;
  QPoint local_58;
  undefined8 uStack_50;
  QWidget *pQStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar15 = (QObject *)QGuiApplication::screenAt(p);
  this_00 = &this->popupScreen;
  QWeakPointer<QObject>::assign<QObject>(&this_00->wp,pQVar15);
  pQVar3 = this->scroll;
  if (pQVar3 != (QMenuScroller *)0x0) {
    if (pQVar3->scrollOffset != 0) {
      this->field_0x420 = this->field_0x420 | 1;
    }
    pQVar3->scrollOffset = 0;
    pQVar3->scrollFlags = '\0';
  }
  this->motions = 0;
  *(ushort *)&this->field_0x420 = (ushort)*(undefined4 *)&this->field_0x420 & 0xe7ff | 0x1000;
  updateLayoutDirection(this);
  QWidget::ensurePolished(this_02);
  if (this->eventLoop == (QEventLoop *)0x0) {
    pQVar16 = QWidgetPrivate::topData(&this->super_QWidgetPrivate);
    pDVar4 = (pQVar16->initialScreen).wp.d;
    if (((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) ||
       (pQVar15 = (pQVar16->initialScreen).wp.value, pQVar15 == (QObject *)0x0)) {
      pQVar18 = &QtPrivate::qobject_cast_helper<QMenu*,QObject>
                           (*(QObject **)&(this->super_QWidgetPrivate).field_0x10)->super_QWidget;
      if (pQVar18 != (QWidget *)0x0) {
        pQVar15 = (QObject *)QWidget::screen(pQVar18);
        goto LAB_00423c59;
      }
      bVar8 = QWidgetPrivate::setScreenForPoint(&this->super_QWidgetPrivate,p);
    }
    else {
LAB_00423c59:
      bVar8 = QWidgetPrivate::setScreen(&this->super_QWidgetPrivate,(QScreen *)pQVar15);
    }
    if (bVar8 != false) {
      this->field_0x420 = this->field_0x420 | 1;
    }
  }
  bVar8 = isContextMenu(this);
  if (((*(ushort *)&this->field_0x420 & 4) == 0) == bVar8) {
    *(ushort *)&this->field_0x420 = (*(ushort *)&this->field_0x420 & 0xfffa) + (ushort)bVar8 * 4 + 1
    ;
  }
  pQVar17 = QWidgetPrivate::windowHandle(&this->super_QWidgetPrivate,Direct);
  if (pQVar17 == (QWindow *)0x0) {
    QWidgetPrivate::createWinId(&this->super_QWidgetPrivate);
  }
  pQVar18 = topCausedWidget(this);
  pQVar19 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(&pQVar18->super_QObject);
  QWidget::setAttribute(this_02,WA_X11NetWmWindowTypeDropDownMenu,pQVar19 != (QMenuBar *)0x0);
  QMenu::aboutToShow((QMenu *)this_02);
  bVar9 = this->field_0x420;
  bVar8 = bypassGraphicsProxyWidget(this_02);
  if ((bVar8) ||
     (pQVar20 = QWidgetPrivate::nearestGraphicsProxyWidget(this_02),
     pQVar20 == (QGraphicsProxyWidget *)0x0)) {
    screen = (QScreen *)QGuiApplication::screenAt(p);
  }
  else {
    screen = (QScreen *)0x0;
  }
  QVar37 = popupGeometry(this,screen);
  local_68 = QVar37;
  updateActionRects(this,&local_68);
  local_70.xp.m_i = 0;
  local_70.yp.m_i = 0;
  pDVar4 = (this->causedPopup).widget.wp.d;
  if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
    pQVar15 = (QObject *)0x0;
  }
  else {
    pQVar15 = (this->causedPopup).widget.wp.value;
  }
  pQVar21 = QtPrivate::qobject_cast_helper<QPushButton*,QObject>(pQVar15);
  if ((~bVar9 & 1) == 0 && pQVar21 != (QPushButton *)0x0) {
    local_70 = QPushButtonPrivate::adjustedMenuPosition
                         (*(QPushButtonPrivate **)
                           &(pQVar21->super_QAbstractButton).super_QWidget.field_0x8);
  }
  else {
    local_70 = *p;
  }
  pQVar15 = (QObject *)QGuiApplication::screenAt(&local_70);
  QWeakPointer<QObject>::assign<QObject>(&this_00->wp,pQVar15);
  menuSizeHint = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_c0 = (QSize)(**(code **)(*(long *)this_02 + 0x70))();
  local_a8 = (int)local_c0.ht.m_i;
  menuSizeHint = local_c0;
  if ((in_RCX->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_70 = std::function<QPoint_(const_QSize_&)>::operator()(in_RCX,&menuSizeHint);
  }
  pQVar22 = QWidget::style(this_02);
  RVar13.m_i = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x20,0,this_02);
  pQVar18 = QWidget::window(this_02);
  bVar8 = QWidget::testAttribute_helper(pQVar18,WA_DontShowOnScreen);
  iVar30 = (QVar37.y2.m_i.m_i - QVar37.y1.m_i) + 1;
  iVar27 = QVar37.x2.m_i.m_i + 1;
  local_b8 = QVar37.x1.m_i;
  if ((iVar30 < local_a8) || (iVar27 - local_b8.m_i < local_c0.wd.m_i)) {
LAB_00423e75:
    RVar28.m_i = iVar27 - (local_b8.m_i + RVar13.m_i * 2);
    if (menuSizeHint.wd.m_i < RVar28.m_i) {
      RVar28.m_i = menuSizeHint.wd.m_i;
    }
    local_c0.ht.m_i = 0;
    local_c0.wd.m_i = RVar28.m_i;
    local_a8 = iVar30 + RVar13.m_i * -2;
    if (menuSizeHint.ht.m_i < local_a8) {
      local_a8 = menuSizeHint.ht.m_i;
    }
    bVar9 = this->ncols;
    bVar8 = true;
  }
  else {
    bVar8 = !bVar8;
    bVar9 = this->ncols;
    if ((1 < bVar9) && (local_a8 < iVar30)) goto LAB_00423e75;
  }
  if (bVar9 < 2) {
    if (atAction != (QAction *)0x0) {
      pQVar5 = (this->actionRects).d.ptr;
      lVar31 = 0xc;
      iVar27 = 0;
      for (uVar29 = 0; uVar29 < (ulong)(this->super_QWidgetPrivate).actions.d.size;
          uVar29 = uVar29 + 1) {
        if ((this->super_QWidgetPrivate).actions.d.ptr[uVar29] == atAction) {
          local_70.yp.m_i = local_70.yp.m_i - iVar27;
          pQVar3 = this->scroll;
          if ((pQVar3 == (QMenuScroller *)0x0) || (RVar13.m_i <= local_70.yp.m_i)) {
            if ((pQVar3 == (QMenuScroller *)0x0) || (pQVar3->scrollFlags == '\0')) break;
          }
          else {
            pQVar3->scrollFlags = pQVar3->scrollFlags | 1;
            pQVar3->scrollOffset = local_70.yp.m_i;
            local_70.yp.m_i = RVar13.m_i;
          }
          pQVar22 = QWidget::style(this_02);
          iVar30 = (**(code **)(*(long *)pQVar22 + 0xf0))(pQVar22,0x2d,0,this_02,0);
          if (iVar30 == 0) {
            uVar23 = (this->actionRects).d.size;
            local_a8 = iVar27 + this->scroll->scrollOffset;
            if (uVar23 <= uVar29) {
              uVar23 = uVar29;
            }
            piVar36 = (int *)((long)&(((this->actionRects).d.ptr)->x1).m_i + lVar31);
            for (; uVar29 != uVar23; uVar23 = uVar23 - 1) {
              local_a8 = ((local_a8 + *piVar36) - piVar36[-2]) + 1;
              piVar36 = piVar36 + 4;
            }
          }
          break;
        }
        iVar27 = ((iVar27 + *(int *)((long)&(pQVar5->x1).m_i + lVar31)) -
                 *(int *)((long)pQVar5 + lVar31 + -8)) + 1;
        lVar31 = lVar31 + 0x10;
      }
    }
  }
  else {
    local_70.yp.m_i = QVar37.y1.m_i.m_i + RVar13.m_i;
  }
  QVar37 = QWidget::childrenRect(this_02);
  if ((QVar37.x2.m_i.m_i < QVar37.x1.m_i.m_i) || (QVar37.y2.m_i.m_i < QVar37.y1.m_i.m_i)) {
    this_03 = (this->actionRects).d.ptr;
    lVar31 = (this->actionRects).d.size;
    lVar35 = lVar31 * 0x10;
    pQVar5 = this_03 + lVar31;
    for (lVar31 = lVar31 >> 2; pQVar34 = this_03, 0 < lVar31; lVar31 = lVar31 + -1) {
      bVar10 = QRect::isNull(this_03);
      if (!bVar10) goto LAB_00424034;
      bVar10 = QRect::isNull(this_03 + 1);
      pQVar34 = this_03 + 1;
      if (!bVar10) goto LAB_00424034;
      bVar10 = QRect::isNull(this_03 + 2);
      pQVar34 = this_03 + 2;
      if (!bVar10) goto LAB_00424034;
      bVar10 = QRect::isNull(this_03 + 3);
      pQVar34 = this_03 + 3;
      if (!bVar10) goto LAB_00424034;
      this_03 = this_03 + 4;
      lVar35 = lVar35 + -0x40;
    }
    lVar35 = lVar35 >> 4;
    if (lVar35 == 1) {
LAB_0042484c:
      bVar10 = QRect::isNull(this_03);
      pQVar34 = this_03;
      if (bVar10) {
        pQVar34 = pQVar5;
      }
LAB_00424034:
      if (pQVar34 != pQVar5) goto LAB_0042403d;
    }
    else {
      if (lVar35 == 2) {
LAB_00424835:
        bVar10 = QRect::isNull(this_03);
        pQVar34 = this_03;
        if (bVar10) {
          this_03 = this_03 + 1;
          goto LAB_0042484c;
        }
        goto LAB_00424034;
      }
      if (lVar35 == 3) {
        bVar10 = QRect::isNull(this_03);
        if (bVar10) {
          this_03 = this_03 + 1;
          goto LAB_00424835;
        }
        goto LAB_00424034;
      }
    }
    this->eventLoop = (QEventLoop *)0x0;
    QWeakPointer<QObject>::assign<QObject>(&(this->syncAction).wp,(QObject *)0x0);
    goto LAB_00424794;
  }
LAB_0042403d:
  this_01 = &this->causedPopup;
  mouse = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  mouse = (QPoint)QGuiApplicationPrivate::QLastCursorPosition::toPoint();
  qVar6 = _operator<<;
  (this->mousePopupPos).xp = QGuiApplicationPrivate::lastCursorPosition;
  (this->mousePopupPos).yp = qVar6;
  bVar10 = QPointer::operator_cast_to_bool((QPointer *)this_01);
  if (bVar10) {
    cVar11 = '\0';
  }
  else {
    RVar14 = (*p).xp;
    RVar32 = (*p).yp;
    local_58.yp.m_i = RVar32.m_i + -3;
    local_58.xp.m_i = RVar14.m_i + -3;
    uStack_50._4_4_ = RVar32.m_i + 2;
    uStack_50._0_4_ = RVar14.m_i + 2;
    cVar11 = QRect::contains(&local_58,SUB81(&mouse,0));
  }
  if (bVar8) {
    bVar8 = QWidget::isRightToLeft(this_02);
    if (bVar8) {
      if (cVar11 != '\0') {
        local_70.xp.m_i = mouse.xp.m_i - local_c0.wd.m_i;
      }
      pDVar4 = (this_01->widget).wp.d;
      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
        pQVar15 = (QObject *)0x0;
      }
      else {
        pQVar15 = (this->causedPopup).widget.wp.value;
      }
      pQVar19 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(pQVar15);
      if (pQVar19 == (QMenuBar *)0x0) {
        pDVar4 = (this_01->widget).wp.d;
        if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
          pQVar15 = (QObject *)0x0;
        }
        else {
          pQVar15 = (this->causedPopup).widget.wp.value;
        }
        pQVar24 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar15);
        if (pQVar24 != (QMenu *)0x0) goto LAB_00424243;
        RVar14.m_i = local_70.xp.m_i;
      }
      else {
LAB_00424243:
        RVar14.m_i = local_70.xp.m_i - local_c0.wd.m_i;
        local_70.xp.m_i = RVar14.m_i;
      }
      iVar27 = local_68.x1.m_i + RVar13.m_i;
      if (RVar14.m_i < iVar27) {
        iVar30 = (p->xp).m_i;
        RVar14.m_i = iVar27;
        if (iVar27 < iVar30) {
          RVar14.m_i = iVar30;
        }
        local_70.xp.m_i = RVar14.m_i;
      }
      if (local_68.x2.m_i - RVar13.m_i < local_c0.wd.m_i + RVar14.m_i + -1) {
        iVar27 = (p->xp).m_i - local_c0.wd.m_i;
        RVar14.m_i = (local_68.x2.m_i - (local_c0.wd.m_i + RVar13.m_i)) + 1;
        if (RVar14.m_i < iVar27) {
          RVar14.m_i = iVar27;
        }
        local_70.xp.m_i = RVar14.m_i;
      }
    }
    else {
      RVar14.m_i = local_70.xp.m_i;
      if (local_68.x2.m_i - RVar13.m_i < local_c0.wd.m_i + local_70.xp.m_i + -1) {
        RVar14.m_i = (local_68.x2.m_i - (local_c0.wd.m_i + RVar13.m_i)) + 1;
        local_70.xp.m_i = RVar14.m_i;
      }
      if (RVar14.m_i < local_68.x1.m_i + RVar13.m_i) {
        local_70.xp.m_i = local_68.x1.m_i + RVar13.m_i;
      }
    }
    RVar14.m_i = local_70.yp.m_i;
    if (local_68.y2.m_i - RVar13.m_i < local_a8 + local_70.yp.m_i + -1) {
      if (cVar11 == '\0') {
        iVar27 = (p->yp).m_i - (local_a8 + RVar13.m_i);
        RVar14.m_i = (local_68.y2.m_i - (local_a8 + RVar13.m_i)) + 1;
        if (RVar14.m_i < iVar27) {
          RVar14.m_i = iVar27;
        }
      }
      else {
        iVar27 = mouse.yp.m_i - (local_a8 + RVar13.m_i);
        RVar14.m_i = (local_68.y2.m_i - (local_a8 + RVar13.m_i)) + 1;
        if (iVar27 < RVar14.m_i) {
          RVar14.m_i = iVar27;
        }
      }
      local_70.yp.m_i = RVar14.m_i;
    }
    RVar32.m_i = local_68.y1.m_i + RVar13.m_i;
    if (RVar14.m_i < RVar32.m_i) {
      local_70.yp.m_i = RVar32.m_i;
      RVar14.m_i = RVar32.m_i;
    }
    if (local_68.y2.m_i - RVar13.m_i < menuSizeHint.ht.m_i + RVar14.m_i + -1) {
      if (this->scroll == (QMenuScroller *)0x0) {
        local_70.yp.m_i = (local_68.y2.m_i - local_a8) + 1;
      }
      else {
        pqVar1 = &this->scroll->scrollFlags;
        *pqVar1 = *pqVar1 | 2;
        if (RVar14.m_i < local_68.y1.m_i) {
          RVar14.m_i = local_68.y1.m_i;
        }
        local_a8 = local_68.y2.m_i - (RVar14.m_i + RVar13.m_i * 2);
      }
    }
  }
  pQVar22 = QWidget::style(this_02);
  pQVar15 = (QObject *)0x0;
  iVar27 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x57,0,this_02);
  pDVar4 = (this_01->widget).wp.d;
  if (pDVar4 != (Data *)0x0) {
    if (*(int *)(pDVar4 + 4) == 0) {
      pQVar15 = (QObject *)0x0;
    }
    else {
      pQVar15 = (this->causedPopup).widget.wp.value;
    }
  }
  pQVar18 = &QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar15)->super_QWidget;
  if (pQVar18 != (QWidget *)0x0) {
    RVar7.m_i = local_68.x1.m_i;
    iVar30 = local_68.x2.m_i + 1;
    if (menuSizeHint.wd.m_i +
        (((pQVar18->data->crect).x2.m_i + iVar27) - (pQVar18->data->crect).x1.m_i) + 1 <
        iVar30 - local_68.x1.m_i) {
      QVar37 = actionRect(*(QMenuPrivate **)&pQVar18->field_0x8,
                          (*(QMenuPrivate **)&pQVar18->field_0x8)->currentAction);
      local_58 = QVar37._0_8_;
      QVar25 = QWidget::mapToGlobal(pQVar18,&local_58);
      RVar13 = QVar25.xp.m_i;
      iVar33 = (RVar13.m_i - QVar37.x1.m_i) + QVar37.x2.m_i.m_i;
      bVar8 = QWidget::isRightToLeft(this_02);
      if (bVar8) {
        if ((RVar13.m_i - iVar27 < menuSizeHint.wd.m_i + local_70.xp.m_i) &&
           (local_70.xp.m_i < iVar33)) {
          local_70.xp.m_i = RVar13.m_i - menuSizeHint.wd.m_i;
          if (RVar13.m_i - menuSizeHint.wd.m_i < RVar7.m_i) {
            local_70.xp.m_i = iVar33;
          }
          if (iVar30 < menuSizeHint.wd.m_i + local_70.xp.m_i) {
            local_70.xp.m_i = RVar7.m_i;
          }
        }
      }
      else if ((local_70.xp.m_i < iVar27 + iVar33) &&
              (RVar13.m_i < local_70.xp.m_i + menuSizeHint.wd.m_i)) {
        local_70.xp.m_i = RVar13.m_i - menuSizeHint.wd.m_i;
        if (menuSizeHint.wd.m_i + iVar33 <= iVar30) {
          local_70.xp.m_i = iVar33;
        }
        if (local_70.xp.m_i < RVar7.m_i) {
          local_70.xp.m_i = iVar30 - menuSizeHint.wd.m_i;
        }
      }
    }
  }
  pQVar15 = (QObject *)QGuiApplication::screenAt(&local_70);
  QWeakPointer<QObject>::assign<QObject>(&this_00->wp,pQVar15);
  local_58 = local_70;
  uStack_50._4_4_ = local_a8 + -1 + local_70.yp.m_i;
  uStack_50._0_4_ = local_c0.wd.m_i + -1 + local_70.xp.m_i;
  QWidget::setGeometry(this_02,(QRect *)&local_58);
  bVar8 = QWidget::isRightToLeft(this_02);
  orient = 2 - bVar8;
  bVar8 = QWidget::isRightToLeft(this_02);
  uVar26 = local_c0.wd.m_i >> 0x1f;
  if (bVar8) {
    if ((cVar11 == '\0') ||
       ((int)((long)((ulong)uVar26 << 0x20 | (ulong)local_c0 & 0xffffffff) / 2) + local_70.xp.m_i <=
        mouse.xp.m_i)) {
      pDVar4 = (this_01->widget).wp.d;
      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
        pQVar15 = (QObject *)0x0;
      }
      else {
        pQVar15 = (this->causedPopup).widget.wp.value;
      }
      pQVar24 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar15);
      if (pQVar24 != (QMenu *)0x0) {
        iVar30 = (int)((long)((ulong)uVar26 << 0x20 | (ulong)local_c0 & 0xffffffff) / 2) +
                 local_70.xp.m_i;
        iVar27 = QWidget::x((QWidget *)(this->causedPopup).widget.wp.value);
        if (iVar27 < iVar30) goto LAB_0042459c;
      }
    }
    else {
LAB_0042459c:
      orient = 2;
    }
  }
  else if ((cVar11 == '\0') ||
          (mouse.xp.m_i <=
           (int)((long)((ulong)uVar26 << 0x20 | (ulong)local_c0 & 0xffffffff) / 2) + local_70.xp.m_i
          )) {
    pDVar4 = (this_01->widget).wp.d;
    if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
      pQVar15 = (QObject *)0x0;
    }
    else {
      pQVar15 = (this->causedPopup).widget.wp.value;
    }
    pQVar24 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar15);
    if (pQVar24 != (QMenu *)0x0) {
      iVar30 = (int)((long)((ulong)uVar26 << 0x20 | (ulong)local_c0 & 0xffffffff) / 2) +
               local_70.xp.m_i;
      iVar27 = QWidget::x((QWidget *)(this->causedPopup).widget.wp.value);
      if (iVar30 < iVar27) goto LAB_004245d6;
    }
  }
  else {
LAB_004245d6:
    orient = 1;
  }
  if (cVar11 == '\0') {
LAB_004245f8:
    pDVar4 = (this_01->widget).wp.d;
    if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
      pQVar15 = (QObject *)0x0;
    }
    else {
      pQVar15 = (this->causedPopup).widget.wp.value;
    }
    pQVar19 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(pQVar15);
    if (pQVar19 != (QMenuBar *)0x0) {
      iVar27 = (int)((long)((ulong)uVar26 << 0x20 | (ulong)local_c0 & 0xffffffff) / 2) +
               local_70.yp.m_i;
      pQVar18 = (QWidget *)(this->causedPopup).widget.wp.value;
      this_04 = (QWidget *)0x0;
      if (*(int *)((this->causedPopup).widget.wp.d + 4) != 0) {
        this_04 = pQVar18;
      }
      local_58 = QWidget::pos(pQVar18);
      QVar25 = QWidget::mapToGlobal(this_04,&local_58);
      if (iVar27 < QVar25.yp.m_i.m_i) goto LAB_0042466e;
    }
    uVar26 = 8;
  }
  else {
    if (mouse.yp.m_i <= local_a8 / 2 + local_70.yp.m_i) goto LAB_004245f8;
LAB_0042466e:
    uVar26 = 4;
  }
  bVar8 = QApplication::isEffectEnabled(UI_AnimateMenu);
  if (bVar8) {
    pDVar4 = (this_01->widget).wp.d;
    if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
      pQVar15 = (QObject *)0x0;
    }
    else {
      pQVar15 = (this->causedPopup).widget.wp.value;
    }
    pQVar19 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(pQVar15);
    if (pQVar19 == (QMenuBar *)0x0) {
      pDVar4 = (this_01->widget).wp.d;
      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
        pQVar15 = (QObject *)0x0;
      }
      else {
        pQVar15 = (this->causedPopup).widget.wp.value;
      }
      pQVar24 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar15);
      if (pQVar24 != (QMenu *)0x0) {
        lVar31 = *(long *)&(pQVar24->super_QWidget).field_0x8;
        uVar2 = *(ushort *)(lVar31 + 0x420);
        uVar12 = uVar2 >> 0xc;
        *(ushort *)(lVar31 + 0x420) = uVar2 & 0xefff;
        goto LAB_00424705;
      }
    }
    else {
      lVar31 = *(long *)&(pQVar19->super_QWidget).field_0x8;
      uVar12 = (ushort)*(byte *)(lVar31 + 0x2f8);
      *(undefined1 *)(lVar31 + 0x2f8) = 0;
LAB_00424705:
      if ((uVar12 & 1) == 0) {
        qFadeEffect((QWidget *)0x0,-1);
        qScrollEffect((QWidget *)0x0,8,-1);
        goto LAB_0042473e;
      }
    }
    bVar8 = QApplication::isEffectEnabled(UI_FadeMenu);
    if (bVar8) {
      qFadeEffect(this_02,-1);
    }
    else {
      bVar8 = QPointer::operator_cast_to_bool((QPointer *)this_01);
      if (bVar8) {
        pDVar4 = (this_01->widget).wp.d;
        if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
          pQVar15 = (QObject *)0x0;
        }
        else {
          pQVar15 = (this->causedPopup).widget.wp.value;
        }
        pQVar24 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar15);
        if (pQVar24 == (QMenu *)0x0) {
          orient = uVar26;
        }
      }
      else {
        orient = uVar26 | orient;
      }
      qScrollEffect(this_02,orient,-1);
    }
  }
  else {
LAB_0042473e:
    QWidget::show(this_02);
  }
  local_58 = (QPoint)QFont::strikeOut;
  uStack_50._0_4_ = 6;
  uStack_50._4_4_ = -0x55555556;
  local_40 = 0xaaaaaaaaffffffff;
  pQStack_48 = this_02;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
LAB_00424794:
  QWeakPointer<QObject>::clear(&this_00->wp);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::popup(const QPoint &p, QAction *atAction, PositionFunction positionFunction)
{
    Q_Q(QMenu);
    popupScreen = QGuiApplication::screenAt(p);
    QScopeGuard popupScreenGuard([this](){ popupScreen.clear(); });

    if (scroll) { // reset scroll state from last popup
        if (scroll->scrollOffset)
            itemsDirty = 1; // sizeHint will be incorrect if there is previous scroll
        scroll->scrollOffset = 0;
        scroll->scrollFlags = QMenuPrivate::QMenuScroller::ScrollNone;
    }
    tearoffHighlighted = 0;
    motions = 0;
    doChildEffects = true;
    updateLayoutDirection();

    q->ensurePolished(); // Get the right font

    // Ensure that we get correct sizeHints by placing this window on the correct screen.
    // However if the QMenu was constructed with a Qt::Desktop widget as its parent,
    // then initialScreenIndex was set, so we should respect that for the lifetime of this menu.
    // However if eventLoop exists, then exec() already did this by calling createWinId(); so leave it alone. (QTBUG-76162)
    if (!eventLoop) {
        bool screenSet = false;
        QScreen *screen = topData()->initialScreen;
        if (screen) {
            if (setScreen(screen))
                itemsDirty = true;
            screenSet = true;
        } else if (QMenu *parentMenu = qobject_cast<QMenu *>(parent)) {
            // a submenu is always opened from an open parent menu,
            // so show it on the same screen where the parent is. (QTBUG-76162)
            if (setScreen(parentMenu->screen()))
                itemsDirty = true;
            screenSet = true;
        }
        if (!screenSet && setScreenForPoint(p))
            itemsDirty = true;
    }

    const bool contextMenu = isContextMenu();
    if (lastContextMenu != contextMenu) {
        itemsDirty = true;
        lastContextMenu = contextMenu;
    }

    // Until QWidget::metric accepts the screen set on a widget (without having a window handle)
    // we need to make sure we get a window handle. This must be done near here because
    // we want the screen to be correctly set and items to be marked dirty.
    // (and screen set could 'fail' on oldscreen == newScreen if created before causing the
    // itemsDirty not to be set though needed to get the correct size on first show).
    if (!windowHandle()) {
        createWinId();
    }

#if QT_CONFIG(menubar)
    // if this menu is part of a chain attached to a QMenuBar, set the
    // _NET_WM_WINDOW_TYPE_DROPDOWN_MENU X11 window type
    q->setAttribute(Qt::WA_X11NetWmWindowTypeDropDownMenu, qobject_cast<QMenuBar *>(topCausedWidget()) != nullptr);
#endif

    emit q->aboutToShow();
    const bool actionListChanged = itemsDirty;

    QRect screen;
#if QT_CONFIG(graphicsview)
    bool isEmbedded = !bypassGraphicsProxyWidget(q) && QMenuPrivate::nearestGraphicsProxyWidget(q);
    if (isEmbedded)
        screen = popupGeometry();
    else
#endif
    screen = popupGeometry(QGuiApplication::screenAt(p));
    updateActionRects(screen);

    QPoint pos;
    QPushButton *causedButton = qobject_cast<QPushButton*>(causedPopup.widget);
    if (actionListChanged && causedButton)
        pos = QPushButtonPrivate::get(causedButton)->adjustedMenuPosition();
    else
        pos = p;
    popupScreen = QGuiApplication::screenAt(pos);

    const QSize menuSizeHint(q->sizeHint());
    QSize size = menuSizeHint;

    if (positionFunction)
        pos = positionFunction(menuSizeHint);

    const int desktopFrame = q->style()->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, nullptr, q);
    bool adjustToDesktop = !q->window()->testAttribute(Qt::WA_DontShowOnScreen);

    // if the screens have very different geometries and the menu is too big, we have to recalculate
    if ((size.height() > screen.height() || size.width() > screen.width()) ||
        // Layout is not right, we might be able to save horizontal space
        (ncols >1 && size.height() < screen.height())) {
        size.setWidth(qMin(menuSizeHint.width(), screen.width() - desktopFrame * 2));
        size.setHeight(qMin(menuSizeHint.height(), screen.height() - desktopFrame * 2));
        adjustToDesktop = true;
    }

#ifdef QT_KEYPAD_NAVIGATION
    if (!atAction && QApplicationPrivate::keypadNavigationEnabled()) {
        // Try to have one item activated
        if (defaultAction && defaultAction->isEnabled()) {
            atAction = defaultAction;
            // TODO: This works for first level menus, not yet sub menus
        } else {
            for (QAction *action : std::as_const(actions))
                if (action->isEnabled()) {
                    atAction = action;
                    break;
                }
        }
        currentAction = atAction;
    }
#endif
    if (ncols > 1) {
        pos.setY(screen.top() + desktopFrame);
    } else if (atAction) {
        for (int i = 0, above_height = 0; i < actions.size(); i++) {
            QAction *action = actions.at(i);
            if (action == atAction) {
                int newY = pos.y() - above_height;
                if (scroll && newY < desktopFrame) {
                    scroll->scrollFlags = scroll->scrollFlags
                                             | QMenuPrivate::QMenuScroller::ScrollUp;
                    scroll->scrollOffset = newY;
                    newY = desktopFrame;
                }
                pos.setY(newY);

                if (scroll && scroll->scrollFlags != QMenuPrivate::QMenuScroller::ScrollNone
                    && !q->style()->styleHint(QStyle::SH_Menu_FillScreenWithScroll, nullptr, q)) {
                    int below_height = above_height + scroll->scrollOffset;
                    for (int i2 = i; i2 < actionRects.size(); i2++)
                        below_height += actionRects.at(i2).height();
                    size.setHeight(below_height);
                }
                break;
            } else {
                above_height += actionRects.at(i).height();
            }
        }
    }

    // Do nothing if we don't have a valid size, e.g. when all actions are invisible
    // and there are no child widgets.
    const auto rectIsNull = [](const QRect &rect) { return rect.isNull(); };
    if (q->childrenRect().isEmpty()
     && std::all_of(actionRects.cbegin(), actionRects.cend(), rectIsNull)) {
        eventLoop = nullptr;
        syncAction = nullptr;
        return;
    }

    // Note that QGuiApplicationPrivate::lastCursorPosition isn't a QPointF,
    // so these two statements can't be simplified...
    const QPoint mouse = QGuiApplicationPrivate::lastCursorPosition.toPoint();
    mousePopupPos = QGuiApplicationPrivate::lastCursorPosition;
    const bool snapToMouse = !causedPopup.widget && (QRect(p.x() - 3, p.y() - 3, 6, 6).contains(mouse));

    if (adjustToDesktop) {
        // handle popup falling "off screen"
        if (q->isRightToLeft()) {
            if (snapToMouse) // position flowing left from the mouse
                pos.setX(mouse.x() - size.width());

#if QT_CONFIG(menubar)
            // if the menu is in a menubar or is a submenu, it should be right-aligned
            if (qobject_cast<QMenuBar*>(causedPopup.widget) || qobject_cast<QMenu*>(causedPopup.widget))
                pos.rx() -= size.width();
#endif // QT_CONFIG(menubar)

            if (pos.x() < screen.left() + desktopFrame)
                pos.setX(qMax(p.x(), screen.left() + desktopFrame));
            if (pos.x() + size.width() - 1 > screen.right() - desktopFrame)
                pos.setX(qMax(p.x() - size.width(), screen.right() - desktopFrame - size.width() + 1));
        } else {
            if (pos.x() + size.width() - 1 > screen.right() - desktopFrame)
                pos.setX(screen.right() - desktopFrame - size.width() + 1);
            if (pos.x() < screen.left() + desktopFrame)
                pos.setX(screen.left() + desktopFrame);
        }
        if (pos.y() + size.height() - 1 > screen.bottom() - desktopFrame) {
            if (snapToMouse)
                pos.setY(qMin(mouse.y() - (size.height() + desktopFrame), screen.bottom()-desktopFrame-size.height()+1));
            else
                pos.setY(qMax(p.y() - (size.height() + desktopFrame), screen.bottom()-desktopFrame-size.height()+1));
        }

        if (pos.y() < screen.top() + desktopFrame)
            pos.setY(screen.top() + desktopFrame);
        if (pos.y() + menuSizeHint.height() - 1 > screen.bottom() - desktopFrame) {
            if (scroll) {
                scroll->scrollFlags |= uint(QMenuPrivate::QMenuScroller::ScrollDown);
                int y = qMax(screen.y(),pos.y());
                size.setHeight(screen.bottom() - (desktopFrame * 2) - y);
            } else {
                // Too big for screen, bias to see bottom of menu (for some reason)
                pos.setY(screen.bottom() - size.height() + 1);
            }
        }
    }

    const int subMenuOffset = q->style()->pixelMetric(QStyle::PM_SubMenuOverlap, nullptr, q);
    QMenu *caused = qobject_cast<QMenu*>(causedPopup.widget);
    if (caused && caused->geometry().width() + menuSizeHint.width() + subMenuOffset < screen.width()) {
        QRect parentActionRect(caused->d_func()->actionRect(caused->d_func()->currentAction));
        const QPoint actionTopLeft = caused->mapToGlobal(parentActionRect.topLeft());
        parentActionRect.moveTopLeft(actionTopLeft);
        if (q->isRightToLeft()) {
            if ((pos.x() + menuSizeHint.width() > parentActionRect.left() - subMenuOffset)
                && (pos.x() < parentActionRect.right()))
            {
                pos.rx() = parentActionRect.left() - menuSizeHint.width();
                if (pos.x() < screen.x())
                    pos.rx() = parentActionRect.right();
                if (pos.x() + menuSizeHint.width() > screen.x() + screen.width())
                    pos.rx() = screen.x();
            }
        } else {
            if ((pos.x() < parentActionRect.right() + subMenuOffset)
                && (pos.x() + menuSizeHint.width() > parentActionRect.left()))
            {
                pos.rx() = parentActionRect.right();
                if (pos.x() + menuSizeHint.width() > screen.x() + screen.width())
                    pos.rx() = parentActionRect.left() - menuSizeHint.width();
                if (pos.x() < screen.x())
                    pos.rx() = screen.x() + screen.width() - menuSizeHint.width();
            }
        }
    }
    popupScreen = QGuiApplication::screenAt(pos);
    q->setGeometry(QRect(pos, size));
#if QT_CONFIG(effects)
    int hGuess = q->isRightToLeft() ? QEffects::LeftScroll : QEffects::RightScroll;
    int vGuess = QEffects::DownScroll;
    if (q->isRightToLeft()) {
        if ((snapToMouse && (pos.x() + size.width() / 2 > mouse.x())) ||
           (qobject_cast<QMenu*>(causedPopup.widget) && pos.x() + size.width() / 2 > causedPopup.widget->x()))
            hGuess = QEffects::RightScroll;
    } else {
        if ((snapToMouse && (pos.x() + size.width() / 2 < mouse.x())) ||
           (qobject_cast<QMenu*>(causedPopup.widget) && pos.x() + size.width() / 2 < causedPopup.widget->x()))
            hGuess = QEffects::LeftScroll;
    }

#if QT_CONFIG(menubar)
    if ((snapToMouse && (pos.y() + size.height() / 2 < mouse.y())) ||
       (qobject_cast<QMenuBar*>(causedPopup.widget) &&
        pos.y() + size.width() / 2 < causedPopup.widget->mapToGlobal(causedPopup.widget->pos()).y()))
       vGuess = QEffects::UpScroll;
#endif
    if (QApplication::isEffectEnabled(Qt::UI_AnimateMenu)) {
        bool doChildEffects = true;
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar*>(causedPopup.widget)) {
            doChildEffects = mb->d_func()->doChildEffects;
            mb->d_func()->doChildEffects = false;
        } else
#endif
        if (QMenu *m = qobject_cast<QMenu*>(causedPopup.widget)) {
            doChildEffects = m->d_func()->doChildEffects;
            m->d_func()->doChildEffects = false;
        }

        if (doChildEffects) {
            if (QApplication::isEffectEnabled(Qt::UI_FadeMenu))
                qFadeEffect(q);
            else if (causedPopup.widget)
                qScrollEffect(q, qobject_cast<QMenu*>(causedPopup.widget) ? hGuess : vGuess);
            else
                qScrollEffect(q, hGuess | vGuess);
        } else {
            // kill any running effect
            qFadeEffect(nullptr);
            qScrollEffect(nullptr);

            q->show();
        }
    } else
#endif
    {
        q->show();
    }

#if QT_CONFIG(accessibility)
    QAccessibleEvent event(q, QAccessible::PopupMenuStart);
    QAccessible::updateAccessibility(&event);
#endif
}